

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

word ** makeArray(Abc_TtStore_t *p)

{
  word **ppwVar1;
  word *pwVar2;
  word **a;
  int i;
  Abc_TtStore_t *p_local;
  
  ppwVar1 = (word **)malloc((long)p->nFuncs << 3);
  for (a._4_4_ = 0; a._4_4_ < p->nFuncs; a._4_4_ = a._4_4_ + 1) {
    pwVar2 = (word *)malloc((long)p->nWords << 3);
    ppwVar1[a._4_4_] = pwVar2;
    memcpy(ppwVar1[a._4_4_],p->pFuncs[a._4_4_],(long)p->nWords << 3);
  }
  return ppwVar1;
}

Assistant:

word** makeArray(Abc_TtStore_t* p)
{
    int i;
    word** a;
    a = (word**)malloc(sizeof(word*)*(p->nFuncs));
    for(i=0;i<p->nFuncs;i++)
    {
        a[i] = (word*)malloc(sizeof(word)*(p->nWords));
        memcpy(a[i],p->pFuncs[i],sizeof(word)*(p->nWords));

    }
    return a;
}